

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LLVMPointsToSet.h
# Opt level: O2

void __thiscall dg::DGLLVMPointsToSet::_findNextReal(DGLLVMPointsToSet *this)

{
  const_iterator *this_00;
  size_t *psVar1;
  Pointer PVar2;
  
  this_00 = &(this->super_LLVMPointsToSetImplTemplate<const_dg::pta::PointerIdPointsToSet_&>).it;
  while( true ) {
    if (((this->super_LLVMPointsToSetImplTemplate<const_dg::pta::PointerIdPointsToSet_&>).it.
         container_it.pos == 0) &&
       ((this->super_LLVMPointsToSetImplTemplate<const_dg::pta::PointerIdPointsToSet_&>).it.
        container_it.container_it.
        super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>._M_cur ==
        (__node_type *)0x0)) {
      return;
    }
    PVar2 = pta::PointerIdPointsToSet::const_iterator::operator*(this_00);
    if ((PVar2.target != pta::NULLPTR) &&
       ((PVar2.target != pta::UNKNOWN_MEMORY &&
        (PVar2 = pta::PointerIdPointsToSet::const_iterator::operator*(this_00),
        PVar2.target != pta::INVALIDATED)))) break;
    ADT::
    SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::STLHashMap<unsigned_long,_unsigned_long>_>
    ::const_iterator::operator++(&this_00->container_it);
    psVar1 = &(this->super_LLVMPointsToSetImplTemplate<const_dg::pta::PointerIdPointsToSet_&>).
              _position;
    *psVar1 = *psVar1 + 1;
  }
  return;
}

Assistant:

void _findNextReal() override {
        while (it != PTSet.end() &&
               (!(*it).isValid() || (*it).isInvalidated())) {
            ++it;
            ++_position;
        }
    }